

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScanTargetGLSLFragments.cpp
# Opt level: O0

string * __thiscall
Outputs::Display::OpenGL::ScanTarget::sampling_function_abi_cxx11_
          (string *__return_storage_ptr__,ScanTarget *this)

{
  Modals *__src;
  char *pcVar1;
  bool bVar2;
  bool is_svideo;
  undefined4 local_60 [2];
  Modals modals;
  ScanTarget *this_local;
  string *fragment_shader;
  
  modals.output_scale.y._1_1_ = 0;
  unique0x10000170 = this;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __src = BufferingScanTarget::modals(&this->super_BufferingScanTarget);
  memcpy(local_60,__src,0x44);
  bVar2 = modals.input_data_type == Luminance8;
  if (bVar2) {
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,"vec2 svideo_sample(vec2 coordinate, float angle) {"
              );
  }
  else {
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               "float composite_sample(vec2 coordinate, float angle) {");
  }
  switch(local_60[0]) {
  case 0:
  case 1:
    pcVar1 = "return textureLod(textureName, coordinate, 0).r;";
    if (bVar2) {
      pcVar1 = "return vec2(textureLod(textureName, coordinate, 0).r, 0.0);";
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar1);
    break;
  case 2:
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               "uint iPhase = uint(step(sign(angle), 0.0) * 3) ^ uint(abs(angle * 2.0 / 3.141592654) ) & 3u;"
              );
    pcVar1 = "return textureLod(textureName, coordinate, 0)[iPhase];";
    if (bVar2) {
      pcVar1 = "return vec2(textureLod(textureName, coordinate, 0)[iPhase], 0.0);";
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar1);
    break;
  case 3:
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               "vec2 yc = textureLod(textureName, coordinate, 0).rg;float phaseOffset = 3.141592654 * 2.0 * 2.0 * yc.y;float rawChroma = step(yc.y, 0.75) * cos(angle + phaseOffset);"
              );
    pcVar1 = "return mix(yc.x, rawChroma, compositeAmplitude);";
    if (bVar2) {
      pcVar1 = "return vec2(yc.x, rawChroma);";
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar1);
    break;
  case 4:
  case 5:
  case 6:
  case 7:
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               "vec3 colour = rgbToLumaChroma * textureLod(textureName, coordinate, 0).rgb;vec2 quadrature = vec2(cos(angle), sin(angle));"
              );
    pcVar1 = "return mix(colour.r, dot(quadrature, colour.gb), compositeAmplitude);";
    if (bVar2) {
      pcVar1 = "return vec2(colour.r, dot(quadrature, colour.gb));";
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar1);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"}");
  return __return_storage_ptr__;
}

Assistant:

std::string ScanTarget::sampling_function() const {
	std::string fragment_shader;
	const auto modals = BufferingScanTarget::modals();
	const bool is_svideo = modals.display_type == DisplayType::SVideo;

	if(is_svideo) {
		fragment_shader +=
			"vec2 svideo_sample(vec2 coordinate, float angle) {";
	} else {
		fragment_shader +=
			"float composite_sample(vec2 coordinate, float angle) {";
	}

	switch(modals.input_data_type) {
		case InputDataType::Luminance1:
		case InputDataType::Luminance8:
			// Easy, just copy across.
			fragment_shader +=
				is_svideo ?
					"return vec2(textureLod(textureName, coordinate, 0).r, 0.0);" :
					"return textureLod(textureName, coordinate, 0).r;";
		break;

		case InputDataType::PhaseLinkedLuminance8:
			fragment_shader +=
				"uint iPhase = uint(step(sign(angle), 0.0) * 3) ^ uint(abs(angle * 2.0 / 3.141592654) ) & 3u;";

			fragment_shader +=
				is_svideo ?
					"return vec2(textureLod(textureName, coordinate, 0)[iPhase], 0.0);" :
					"return textureLod(textureName, coordinate, 0)[iPhase];";
		break;

		case InputDataType::Luminance8Phase8:
			fragment_shader +=
				"vec2 yc = textureLod(textureName, coordinate, 0).rg;"

				"float phaseOffset = 3.141592654 * 2.0 * 2.0 * yc.y;"
				"float rawChroma = step(yc.y, 0.75) * cos(angle + phaseOffset);";

			fragment_shader +=
				is_svideo ?
					"return vec2(yc.x, rawChroma);" :
					"return mix(yc.x, rawChroma, compositeAmplitude);";
		break;

		case InputDataType::Red1Green1Blue1:
		case InputDataType::Red2Green2Blue2:
		case InputDataType::Red4Green4Blue4:
		case InputDataType::Red8Green8Blue8:
			fragment_shader +=
				"vec3 colour = rgbToLumaChroma * textureLod(textureName, coordinate, 0).rgb;"
				"vec2 quadrature = vec2(cos(angle), sin(angle));";

			fragment_shader +=
				is_svideo ?
					"return vec2(colour.r, dot(quadrature, colour.gb));" :
					"return mix(colour.r, dot(quadrature, colour.gb), compositeAmplitude);";
		break;
	}

	fragment_shader += "}";

	return fragment_shader;
}